

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<std::tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>::
     Print(tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *value,ostream *os)

{
  ostream *os_local;
  tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *value_local;
  
  PrintTo<std::vector<unsigned_char,std::allocator<unsigned_char>>&>(value,os);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }